

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Minisat::Solver::~Solver(Solver *this)

{
  Solver *in_RDI;
  
  ~Solver(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

Solver::~Solver()
{
    if (onlineDratChecker) delete onlineDratChecker;
    onlineDratChecker = NULL;
}